

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

void __thiscall
despot::util::tinyxml::TiXmlDocument::TiXmlDocument(TiXmlDocument *this,char *documentName)

{
  size_t len;
  
  (this->super_TiXmlNode).super_TiXmlBase.location.row = -1;
  (this->super_TiXmlNode).super_TiXmlBase.location.col = -1;
  (this->super_TiXmlNode).super_TiXmlBase.userData = (void *)0x0;
  (this->super_TiXmlNode).parent = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).value.rep_ = (Rep *)&TiXmlString::nullrep_;
  (this->super_TiXmlNode).type = DOCUMENT;
  (this->super_TiXmlNode).firstChild = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).lastChild = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).prev = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).next = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase =
       (_func_int **)&PTR__TiXmlDocument_00191978;
  (this->errorDesc).rep_ = (Rep *)&TiXmlString::nullrep_;
  (this->errorLocation).col = -1;
  this->tabsize = 4;
  (this->errorLocation).row = -1;
  this->useMicrosoftBOM = false;
  len = strlen(documentName);
  TiXmlString::assign(&(this->super_TiXmlNode).value,documentName,len);
  this->error = false;
  this->errorId = 0;
  TiXmlString::assign(&this->errorDesc,"",0);
  (this->errorLocation).row = 0;
  (this->errorLocation).col = 0;
  return;
}

Assistant:

TiXmlDocument::TiXmlDocument(const char * documentName) :
	TiXmlNode(TiXmlNode::DOCUMENT) {
	tabsize = 4;
	useMicrosoftBOM = false;
	value = documentName;
	ClearError();
}